

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
DensityCalculator<double,_float>::push_adj
          (DensityCalculator<double,_float> *this,size_t *counts,int ncat,int chosen_cat,
          ScoringMetric scoring_metric)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)ncat;
  if (ncat < 1) {
    uVar3 = uVar5;
  }
  lVar4 = 0;
  iVar2 = 0;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    lVar4 = lVar4 + counts[uVar5];
    iVar2 = (iVar2 + 1) - (uint)(counts[uVar5] == 0);
  }
  sVar1 = counts[chosen_cat];
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  push_adj(this,0.0,(double)iVar2,1.0,
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)),scoring_metric);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_adj(size_t *restrict counts, int ncat, int chosen_cat, ScoringMetric scoring_metric)
{
    /* this one assumes 'categ_present' has entries 0/1 for missing/present */
    int cnt_cat = 0;
    size_t cnt = 0;
    for (int cat = 0; cat < ncat; cat++)
    {
        cnt += counts[cat];
        cnt_cat += counts[cat] > 0;
    }

    double pct_tree_left = (ldouble_safe)counts[chosen_cat] / (ldouble_safe)cnt;
    this->push_adj(0., (double)cnt_cat, 1., pct_tree_left, scoring_metric);
}